

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O2

void __thiscall tcmalloc::PageHeap::InsertToFreeList(PageHeap *this,Span *span)

{
  uint64_t *puVar1;
  ulong uVar2;
  Span *pSVar3;
  bool bVar4;
  uint64_t uVar5;
  Span *pSVar6;
  pair<std::_Rb_tree_iterator<tcmalloc::Span_*>,_bool> pVar7;
  Span *local_10;
  
  local_10 = span;
  if (span < (Span *)0x6) {
    __assert_fail("(void*)span > (void*)(0x5)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0x162,"void tcmalloc::PageHeap::InsertToFreeList(Span *)");
  }
  uVar5 = span->location;
  if (uVar5 == 0) {
    __assert_fail("span->location != Span::IN_USE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0x163,"void tcmalloc::PageHeap::InsertToFreeList(Span *)");
  }
  uVar2 = span->npages;
  if (uVar2 < 0x80) {
    if (uVar5 == 1) {
      this->small_normal_size_[uVar2] = this->small_normal_size_[uVar2] + 1;
      uVar5 = span->npages;
      puVar1 = &(this->stat).small_normal_bytes;
      *puVar1 = *puVar1 + uVar5 * 0x2000;
      pSVar6 = this->small_normal_ + uVar5;
    }
    else {
      this->small_returned_size_[uVar2] = this->small_returned_size_[uVar2] + 1;
      uVar5 = span->npages;
      puVar1 = &(this->stat).small_returned_bytes;
      *puVar1 = *puVar1 + uVar5 * 0x2000;
      pSVar6 = this->small_returned_ + uVar5;
    }
    span->prev = pSVar6;
    pSVar3 = pSVar6->next;
    span->next = pSVar3;
    pSVar3->prev = span;
    pSVar6->next = span;
  }
  else if (uVar5 == 1) {
    pVar7 = std::
            _Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
            ::_M_insert_unique<tcmalloc::Span*const&>
                      ((_Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
                        *)&this->large_normal_,&local_10);
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("result.second",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x172,"void tcmalloc::PageHeap::InsertToFreeList(Span *)");
    }
    uVar5 = local_10->npages;
    puVar1 = &(this->stat).large_normal_bytes;
    *puVar1 = *puVar1 + uVar5 * 0x2000;
  }
  else {
    pVar7 = std::
            _Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
            ::_M_insert_unique<tcmalloc::Span*const&>
                      ((_Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
                        *)&this->large_returned_,&local_10);
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("result.second",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x176,"void tcmalloc::PageHeap::InsertToFreeList(Span *)");
    }
    uVar5 = local_10->npages;
    puVar1 = &(this->stat).large_returned_bytes;
    *puVar1 = *puVar1 + uVar5 * 0x2000;
  }
  puVar1 = &(this->stat).normal_bytes + (local_10->location != 1);
  *puVar1 = *puVar1 + uVar5 * 0x2000;
  bVar4 = CheckSmallList(this);
  if (bVar4) {
    return;
  }
  __assert_fail("CheckSmallList()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                ,0x181,"void tcmalloc::PageHeap::InsertToFreeList(Span *)");
}

Assistant:

void InsertToFreeList(Span* span) {
        assert((void*)span > (void*)(0x5));
        assert(span->location != Span::IN_USE);
        if (span->npages <= spanSmallPages) {
            if (span->location == Span::IN_NORMAL) {
                small_normal_size_[span->npages]++;
                stat.small_normal_bytes += span->npages * spanPageSize;
                ListInsert(&small_normal_[span->npages], span);
            } else {
                small_returned_size_[span->npages]++;
                stat.small_returned_bytes += span->npages * spanPageSize;
                ListInsert(&small_returned_[span->npages], span);
            }
        } else {
            if (span->location == Span::IN_NORMAL) {
                auto result = large_normal_.insert(span);
                // page_id不可能重复
                assert(result.second);
                stat.large_normal_bytes += span->npages * spanPageSize;
            } else {
                auto result = large_returned_.insert(span);
                assert(result.second);
                stat.large_returned_bytes += span->npages * spanPageSize;
            }
        }

        if (span->location == Span::IN_NORMAL) {
            stat.normal_bytes += span->npages * spanPageSize;
        } else {
            stat.returned_bytes += span->npages * spanPageSize;
        }

        assert(CheckSmallList());
    }